

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O2

void * mpp_dec_hal_thread(void *data)

{
  sem_t *__sem;
  int iVar1;
  RK_S32 index_00;
  MppThread *pMVar2;
  MppBufSlots slots;
  MppBufSlots pvVar3;
  MppThreadStatus MVar4;
  MPP_RET MVar5;
  HalTaskGroup pvVar6;
  undefined4 index_01;
  MppThread *this;
  MppDec pvVar7;
  long lVar8;
  HalTaskHnd task;
  RK_S32 index;
  HalTaskHnd local_100;
  MppBufSlots local_f8;
  HalTaskGroup local_f0;
  MppThread *local_e8;
  MppDec local_e0;
  AutoMutex work_lock;
  HalTaskInfo task_info;
  
  pvVar7 = *(MppDec *)((long)data + 0xa8);
  pMVar2 = *(MppThread **)((long)pvVar7 + 0x28);
  local_f8 = *(MppBufSlots *)((long)pvVar7 + 0x30);
  pvVar6 = *(HalTaskGroup *)((long)pvVar7 + 0x78);
  slots = *(MppBufSlots *)((long)pvVar7 + 0x38);
  task = (HalTaskHnd)0x0;
  mpp_clock_start(*(MppClock *)((long)pvVar7 + 0x260));
  __sem = (sem_t *)((long)pvVar7 + 0x1d8);
  this = pMVar2;
  local_f0 = pvVar6;
  local_e8 = pMVar2;
  local_e0 = pvVar7;
  do {
    while( true ) {
      do {
        while( true ) {
          work_lock.mEnabled = 1;
          work_lock.mLock = &pMVar2->mMutexCond[0].mLock;
          pthread_mutex_lock((pthread_mutex_t *)pMVar2->mMutexCond);
          MVar4 = MppThread::get_status(this,THREAD_WORK);
          if (MVar4 != MPP_THREAD_RUNNING) {
            Mutex::Autolock::~Autolock(&work_lock);
            mpp_clock_pause(*(MppClock *)((long)pvVar7 + 0x260));
            if ((*(int *)((long)data + 0x30) != *(int *)((long)data + 0x34)) &&
               (_mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "mpp->mTaskPutCount == mpp->mTaskGetCount","mpp_dec_hal_thread",0x38d),
               (mpp_debug >> 0x1c & 1) != 0)) {
              abort();
            }
            if ((mpp_debug & 4) != 0) {
              _mpp_log_l(4,"mpp_dec","mpp_dec_hal_thread exited\n",(char *)0x0);
            }
            return (void *)0x0;
          }
          MVar5 = hal_task_get_hnd(pvVar6,1,&task);
          if (MVar5 == MPP_OK) break;
          if (*(int *)((long)pvVar7 + 0x1ac) == *(int *)((long)pvVar7 + 0x1b0)) {
            mpp_dec_notify(pvVar7,0x80);
            mpp_clock_start(*(MppClock *)((long)pvVar7 + 0x268));
            MppThread::wait(this,(void *)0x0);
            mpp_clock_pause(*(MppClock *)((long)pvVar7 + 0x268));
          }
          else {
            if (((byte)mpp_dec_debug & 0x40) != 0) {
              _mpp_log_l(4,"mpp_dec","reset: hal reset start\n",(char *)0x0);
            }
            pvVar7 = *(MppDec *)((long)data + 0xa8);
            pvVar3 = *(MppBufSlots *)((long)pvVar7 + 0x30);
            pvVar6 = *(HalTaskGroup *)((long)pvVar7 + 0x78);
            index = -1;
            local_100 = (HalTaskHnd)0x0;
            mpp_dec_flush(pvVar7);
            pthread_mutex_lock((pthread_mutex_t *)(*(long *)((long)pvVar7 + 0x28) + 0xb8));
            while (MVar5 = mpp_buf_slot_dequeue(pvVar3,&index,QUEUE_DISPLAY), MVar5 == MPP_OK) {
              mpp_dec_put_frame((Mpp *)data,index,(HalDecTaskFlag)0x0);
              mpp_buf_slot_clr_flag(pvVar3,index,SLOT_QUEUE_USE);
            }
            while (MVar5 = hal_task_get_hnd(pvVar6,2,&local_100), MVar5 == MPP_OK) {
              if (local_100 != (HalTaskHnd)0x0) {
                hal_task_hnd_set_status(local_100,0);
                local_100 = (HalTaskHnd)0x0;
              }
            }
            pthread_mutex_unlock((pthread_mutex_t *)(*(long *)((long)pvVar7 + 0x28) + 0xb8));
            if (((byte)mpp_dec_debug & 0x40) != 0) {
              _mpp_log_l(4,"mpp_dec","reset: hal reset done\n",(char *)0x0);
            }
            pvVar7 = local_e0;
            *(int *)((long)local_e0 + 0x1b0) = *(int *)((long)local_e0 + 0x1b0) + 1;
            sem_post(__sem);
            pvVar6 = local_f0;
            this = local_e8;
          }
          Mutex::Autolock::~Autolock(&work_lock);
        }
        Mutex::Autolock::~Autolock(&work_lock);
      } while (task == (HalTaskHnd)0x0);
      mpp_clock_start(*(MppClock *)((long)pvVar7 + 0x270));
      *(int *)((long)data + 0x34) = *(int *)((long)data + 0x34) + 1;
      hal_task_hnd_get_info(task,&task_info);
      if (((ulong)task_info.dec.flags & 2) == 0) break;
      mpp_dec_flush(pvVar7);
      mpp_dec_push_display((Mpp *)data,task_info.dec.flags);
      index_01 = task_info.dec.output;
LAB_001470ab:
      mpp_dec_put_frame((Mpp *)data,index_01,task_info.dec.flags);
      hal_task_hnd_set_status(task,0);
      task = (HalTaskHnd)0x0;
      mpp_dec_notify(pvVar7,0x100);
      mpp_clock_pause(*(MppClock *)((long)pvVar7 + 0x270));
    }
    if ((((ulong)task_info.dec.flags & 1) != 0) &&
       ((task_info.dec.valid == 0 || (task_info.dec.output < 0)))) {
      mpp_dec_push_display((Mpp *)data,task_info.dec.flags);
      index_01 = -1;
      goto LAB_001470ab;
    }
    mpp_clock_start(*(MppClock *)((long)pvVar7 + 0x278));
    mpp_hal_hw_wait(*(MppHal *)((long)pvVar7 + 0x18),&task_info);
    mpp_clock_pause(*(MppClock *)((long)pvVar7 + 0x278));
    *(int *)((long)pvVar7 + 0x284) = *(int *)((long)pvVar7 + 0x284) + 1;
    mpp_buf_slot_clr_flag(slots,task_info.dec.input,SLOT_HAL_INPUT);
    hal_task_hnd_set_status(task,(uint)(*(int *)((long)pvVar7 + 0x1f8) == 0) * 2);
    iVar1 = *(int *)((long)pvVar7 + 0x1f8);
    task = (HalTaskHnd)0x0;
    if (-1 < task_info.dec.output) {
      mpp_buf_slot_clr_flag(local_f8,task_info.dec.output,SLOT_HAL_OUTPUT);
    }
    pvVar3 = local_f8;
    for (lVar8 = 0xe; pvVar7 = local_e0, lVar8 != 0x1f; lVar8 = lVar8 + 1) {
      index_00 = *(RK_S32 *)((long)&task_info + lVar8 * 4);
      if (-1 < index_00) {
        mpp_buf_slot_clr_flag(pvVar3,index_00,SLOT_HAL_INPUT);
      }
    }
    if (((ulong)task_info.dec.flags & 1) != 0) {
      mpp_dec_flush(local_e0);
    }
    mpp_dec_push_display((Mpp *)data,task_info.dec.flags);
    mpp_dec_notify(pvVar7,(uint)(iVar1 == 0) << 9 | 0x100);
    mpp_clock_pause(*(MppClock *)((long)pvVar7 + 0x270));
    pvVar6 = local_f0;
    this = local_e8;
  } while( true );
}

Assistant:

void *mpp_dec_hal_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppThread *hal = dec->thread_hal;
    HalTaskGroup tasks = dec->tasks;
    MppBufSlots frame_slots = dec->frame_slots;
    MppBufSlots packet_slots = dec->packet_slots;

    HalTaskHnd  task = NULL;
    HalTaskInfo task_info;
    HalDecTask  *task_dec = &task_info.dec;

    mpp_clock_start(dec->clocks[DEC_HAL_TOTAL]);

    while (1) {
        /* hal thread wait for dxva interface intput first */
        {
            AutoMutex work_lock(hal->mutex());
            if (MPP_THREAD_RUNNING != hal->get_status())
                break;

            if (hal_task_get_hnd(tasks, TASK_PROCESSING, &task)) {
                // process all task then do reset process
                if (dec->hal_reset_post != dec->hal_reset_done) {
                    dec_dbg_reset("reset: hal reset start\n");
                    reset_hal_thread(mpp);
                    dec_dbg_reset("reset: hal reset done\n");
                    dec->hal_reset_done++;
                    sem_post(&dec->hal_reset);
                    continue;
                }

                mpp_dec_notify(dec, MPP_DEC_NOTIFY_TASK_ALL_DONE);
                mpp_clock_start(dec->clocks[DEC_HAL_WAIT]);
                hal->wait();
                mpp_clock_pause(dec->clocks[DEC_HAL_WAIT]);
                continue;
            }
        }

        if (task) {
            RK_U32 notify_flag = MPP_DEC_NOTIFY_TASK_HND_VALID;

            mpp_clock_start(dec->clocks[DEC_HAL_PROC]);
            mpp->mTaskGetCount++;

            hal_task_hnd_get_info(task, &task_info);

            /*
             * check info change flag
             * if this is a frame with that flag, only output an empty
             * MppFrame without any image data for info change.
             */
            if (task_dec->flags.info_change) {
                mpp_dec_flush(dec);
                mpp_dec_push_display(mpp, task_dec->flags);
                mpp_dec_put_frame(mpp, task_dec->output, task_dec->flags);

                hal_task_hnd_set_status(task, TASK_IDLE);
                task = NULL;
                mpp_dec_notify(dec, notify_flag);
                mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
                continue;
            }
            /*
             * check eos task
             * if this task is invalid while eos flag is set, we will
             * flush display queue then push the eos frame to info that
             * all frames have decoded.
             */
            if (task_dec->flags.eos &&
                (!task_dec->valid || task_dec->output < 0)) {
                mpp_dec_push_display(mpp, task_dec->flags);
                /*
                 * Use -1 as invalid buffer slot index.
                 * Reason: the last task maybe is a empty task with eos flag
                 * only but this task may go through vproc process also. We need
                 * create a buffer slot index for it.
                 */
                mpp_dec_put_frame(mpp, -1, task_dec->flags);

                hal_task_hnd_set_status(task, TASK_IDLE);
                task = NULL;
                mpp_dec_notify(dec, notify_flag);
                mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
                continue;
            }

            mpp_clock_start(dec->clocks[DEC_HW_WAIT]);
            mpp_hal_hw_wait(dec->hal, &task_info);
            mpp_clock_pause(dec->clocks[DEC_HW_WAIT]);
            dec->dec_hw_run_count++;

            /*
             * when hardware decoding is done:
             * 1. clear decoding flag (mark buffer is ready)
             * 2. use get_display to get a new frame with buffer
             * 3. add frame to output list
             * repeat 2 and 3 until not frame can be output
             */
            mpp_buf_slot_clr_flag(packet_slots, task_dec->input,
                                  SLOT_HAL_INPUT);

            hal_task_hnd_set_status(task, (dec->parser_fast_mode) ?
                                    (TASK_IDLE) : (TASK_PROC_DONE));

            if (dec->parser_fast_mode)
                notify_flag |= MPP_DEC_NOTIFY_TASK_HND_VALID;
            else
                notify_flag |= MPP_DEC_NOTIFY_TASK_PREV_DONE;

            task = NULL;

            if (task_dec->output >= 0)
                mpp_buf_slot_clr_flag(frame_slots, task_dec->output, SLOT_HAL_OUTPUT);

            for (RK_U32 i = 0; i < MPP_ARRAY_ELEMS(task_dec->refer); i++) {
                RK_S32 index = task_dec->refer[i];
                if (index >= 0)
                    mpp_buf_slot_clr_flag(frame_slots, index, SLOT_HAL_INPUT);
            }
            if (task_dec->flags.eos)
                mpp_dec_flush(dec);
            mpp_dec_push_display(mpp, task_dec->flags);

            mpp_dec_notify(dec, notify_flag);
            mpp_clock_pause(dec->clocks[DEC_HAL_PROC]);
        }
    }

    mpp_clock_pause(dec->clocks[DEC_HAL_TOTAL]);

    mpp_assert(mpp->mTaskPutCount == mpp->mTaskGetCount);
    mpp_dbg_info("mpp_dec_hal_thread exited\n");
    return NULL;
}